

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_bonsai_nlm<int,32ul>::
expand<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>::node_map>
          (compact_bonsai_nlm<int,_32UL> *this,node_map *pos_map)

{
  char_range new_slice;
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  type_conflict *ptVar4;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar5;
  char_range cVar6;
  type_conflict *new_pos_in_chunk;
  type_conflict *new_chunk_id;
  char_range orig_slice;
  uint64_t new_pos;
  type_conflict *pos_in_chunk;
  type_conflict *chunk_id;
  uint64_t pos;
  this_type new_ls;
  compact_bonsai_nlm<int,_32UL> *in_stack_fffffffffffffec8;
  compact_bonsai_nlm<int,_32UL> *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffee0;
  uint8_t *in_stack_fffffffffffffee8;
  uint8_t *in_stack_fffffffffffffef0;
  pair<unsigned_long,_unsigned_long> *chunk_id_00;
  undefined8 in_stack_ffffffffffffff08;
  uint32_t capa_bits;
  compact_bonsai_nlm<int,_32UL> *in_stack_ffffffffffffff10;
  uint8_t *in_stack_ffffffffffffff38;
  undefined1 local_b0 [16];
  char_range local_a0;
  compact_bonsai_nlm<int,_32UL> *local_90;
  type_conflict *local_88;
  size_type *local_80;
  pair<unsigned_long,_unsigned_long> local_68;
  ulong local_58;
  pointer local_20;
  pointer local_18;
  
  capa_bits = (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::size(in_RDI);
  bit_tools::ceil_log2((uint64_t)in_stack_fffffffffffffed0);
  compact_bonsai_nlm<int,_32UL>::compact_bonsai_nlm(in_stack_ffffffffffffff10,capa_bits);
  cVar6.end = in_stack_fffffffffffffee8;
  cVar6.begin = in_stack_fffffffffffffef0;
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    uVar3 = compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            ::node_map::size((node_map *)0x217d3d);
    if (uVar3 <= uVar1) break;
    pVar5 = decompose_value<32ul>((uint64_t)in_stack_fffffffffffffed0);
    chunk_id_00 = &local_68;
    local_68 = pVar5;
    local_80 = std::get<0ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x217d93);
    local_88 = std::get<1ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x217da5);
    local_90 = (compact_bonsai_nlm<int,_32UL> *)
               compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               ::node_map::operator[]((node_map *)cVar6.end,(uint64_t)in_stack_fffffffffffffee0);
    if (local_90 != (compact_bonsai_nlm<int,_32UL> *)0xffffffffffffffff) {
      cVar6 = compact_bonsai_nlm<int,_32UL>::get_slice_
                        (local_90,(uint64_t)chunk_id_00,(uint64_t)cVar6.begin);
      local_a0 = cVar6;
      bVar2 = char_range::empty(&local_a0);
      if (!bVar2) {
        pVar5 = decompose_value<32ul>((uint64_t)in_stack_fffffffffffffed0);
        local_b0._8_8_ = pVar5.second;
        in_stack_fffffffffffffee0 = (pointer)pVar5.first;
        in_stack_fffffffffffffed0 = (compact_bonsai_nlm<int,_32UL> *)local_b0;
        local_b0._0_8_ = in_stack_fffffffffffffee0;
        std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x217e85);
        ptVar4 = std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)0x217e97);
        new_slice.end = (uint8_t *)ptVar4;
        new_slice.begin = in_stack_ffffffffffffff38;
        compact_bonsai_nlm<int,_32UL>::set_slice_
                  ((compact_bonsai_nlm<int,_32UL> *)local_a0.end,(uint64_t)local_a0.begin,
                   (uint64_t)in_RDI,new_slice);
      }
    }
    if (*local_88 == 0x1f) {
      std::
      vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
      ::operator[](in_RDI,*local_80);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    local_58 = local_58 + 1;
  }
  local_20 = in_RDI[2].
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_18 = in_RDI[2].
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  compact_bonsai_nlm<int,_32UL>::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  compact_bonsai_nlm<int,_32UL>::~compact_bonsai_nlm(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void expand(const T& pos_map) {
        this_type new_ls(bit_tools::ceil_log2(ptrs_.size() * ChunkSize * 2));

        for (uint64_t pos = 0; pos < pos_map.size(); ++pos) {
            auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);
            uint64_t new_pos = pos_map[pos];
            if (new_pos != UINT64_MAX) {
                auto orig_slice = get_slice_(chunk_id, pos_in_chunk);
                if (!orig_slice.empty()) {
                    auto [new_chunk_id, new_pos_in_chunk] = decompose_value<ChunkSize>(new_pos);
                    new_ls.set_slice_(new_chunk_id, new_pos_in_chunk, orig_slice);
                }
            }
            if (pos_in_chunk == ChunkSize - 1) {
                ptrs_[chunk_id].reset();
            }
        }

        new_ls.size_ = size_;
#ifdef POPLAR_EXTRA_STATS
        new_ls.max_length_ = max_length_;
        new_ls.sum_length_ = sum_length_;
#endif
        new_ls.label_bytes_ = label_bytes_;
        *this = std::move(new_ls);
    }